

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeEndOfDeclaration
          (Parser *this,char *text,LocationRecorder *location)

{
  LocationRecorder *pLVar1;
  bool bVar2;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  LocationRecorder *local_28;
  LocationRecorder *location_local;
  char *text_local;
  Parser *this_local;
  
  local_28 = location;
  location_local = (LocationRecorder *)text;
  text_local = (char *)this;
  bVar2 = TryConsumeEndOfDeclaration(this,text,location);
  pLVar1 = location_local;
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,(char *)pLVar1,&local_89);
    std::operator+(&local_68,"Expected \"",&local_88);
    std::operator+(&local_48,&local_68,"\".");
    AddError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  return bVar2;
}

Assistant:

bool Parser::ConsumeEndOfDeclaration(
    const char* text, const LocationRecorder* location) {
  if (TryConsumeEndOfDeclaration(text, location)) {
    return true;
  } else {
    AddError("Expected \"" + string(text) + "\".");
    return false;
  }
}